

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O3

int __thiscall mpt::array::set(array *this,convertable *src)

{
  content *pcVar1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  content *__dest;
  iovec vec;
  char *local_30;
  void *local_28;
  size_t local_20;
  
  iVar2 = (**src->_vptr_convertable)(src,0x40,&local_28);
  if ((iVar2 < 0) && (iVar2 = (**src->_vptr_convertable)(src,0x43,&local_28), iVar2 < 0)) {
    iVar2 = (**src->_vptr_convertable)(src,0x73,&local_30);
    if (-1 < iVar2) {
      if (iVar2 == 0) {
        iVar2 = -0x10;
      }
      else {
        sVar4 = strlen(local_30);
        iVar2 = (int)sVar4;
        pvVar3 = set(this,(long)((sVar4 << 0x20) + 0x100000000) >> 0x20,(void *)0x0);
        if (pvVar3 == (void *)0x0) {
          iVar2 = -4;
        }
        else {
          pcVar1 = (this->_buf)._ref;
          if (pcVar1 == (content *)0x0) {
            __dest = (content *)0x0;
          }
          else {
            __dest = (content *)0x0;
            if (*(long *)(pcVar1 + 8) == 0) {
              __dest = pcVar1 + 0x20;
            }
          }
          sVar4 = (long)(sVar4 << 0x20) >> 0x20;
          memcpy(__dest,local_30,sVar4);
          __dest[sVar4] = (content)0x0;
        }
      }
    }
  }
  else {
    pvVar3 = set(this,local_20,local_28);
    iVar2 = (uint)(pvVar3 != (void *)0x0) * 4 + -4;
  }
  return iVar2;
}

Assistant:

int array::set(convertable &src)
{
	struct ::iovec vec;
	
	if (src.convert(TypeVector, &vec) >= 0) {
		return (set(vec.iov_len, vec.iov_base)) ? 0 : BadOperation;
	}
	if (src.convert(MPT_type_toVector('c'), &vec) >= 0) {
		return (set(vec.iov_len, vec.iov_base)) ? 0 : BadOperation;
	}
	char *data;
	int len;
	if ((len = src.convert('s', &data)) < 0) {
		return len;
	}
	if (!len) {
		return MissingData;
	}
	len = strlen(data);
	if (!set(len + 1)) {
		return BadOperation;
	}
	data = (char *) memcpy(base(), data, len);
	data[len] = 0;
	
	return len;
}